

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O0

int get_intra_edge_filter_type(MACROBLOCKD *xd,int plane)

{
  int iVar1;
  int in_ESI;
  long in_RDI;
  MB_MODE_INFO *left;
  MB_MODE_INFO *above;
  uint6 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffde;
  undefined1 in_stack_ffffffffffffffdf;
  bool bVar2;
  undefined8 local_20;
  undefined8 local_18;
  
  if (in_ESI == 0) {
    local_18 = *(long *)(in_RDI + 0x1ed0);
    local_20 = *(long *)(in_RDI + 0x1ec8);
  }
  else {
    local_18 = *(long *)(in_RDI + 0x1ee0);
    local_20 = *(long *)(in_RDI + 0x1ed8);
  }
  if (local_18 != 0) {
    iVar1 = is_smooth((MB_MODE_INFO *)
                      CONCAT17(in_stack_ffffffffffffffdf,
                               CONCAT16(in_stack_ffffffffffffffde,in_stack_ffffffffffffffd8)),0);
    bVar2 = true;
    in_stack_ffffffffffffffdf = bVar2;
    if (iVar1 != 0) goto LAB_006eac3b;
  }
  bVar2 = false;
  if (local_20 != 0) {
    iVar1 = is_smooth((MB_MODE_INFO *)
                      CONCAT17(in_stack_ffffffffffffffdf,(uint7)in_stack_ffffffffffffffd8),0);
    bVar2 = iVar1 != 0;
  }
LAB_006eac3b:
  return (int)bVar2;
}

Assistant:

static int get_intra_edge_filter_type(const MACROBLOCKD *xd, int plane) {
  const MB_MODE_INFO *above;
  const MB_MODE_INFO *left;

  if (plane == 0) {
    above = xd->above_mbmi;
    left = xd->left_mbmi;
  } else {
    above = xd->chroma_above_mbmi;
    left = xd->chroma_left_mbmi;
  }

  return (above && is_smooth(above, plane)) || (left && is_smooth(left, plane));
}